

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O0

void Assimp::FBX::anon_unknown_3::ProcessDataToken
               (TokenList *output_tokens,char **start,char **end,uint line,uint column,
               TokenType type,bool must_have_token)

{
  char **this;
  bool bVar1;
  Token *this_00;
  allocator local_c1;
  string local_c0;
  Token *local_a0;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  char *local_38;
  char *c;
  bool in_double_quotes;
  uint uStack_28;
  bool must_have_token_local;
  TokenType type_local;
  uint column_local;
  uint line_local;
  char **end_local;
  char **start_local;
  TokenList *output_tokens_local;
  
  c._3_1_ = must_have_token;
  c._4_4_ = type;
  uStack_28 = column;
  type_local = line;
  _column_local = end;
  end_local = start;
  start_local = (char **)output_tokens;
  if ((*start == (char *)0x0) || (*end == (char *)0x0)) {
    if (must_have_token) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c0,"unexpected character, expected data token",&local_c1);
      TokenizeError(&local_c0,type_local,uStack_28);
    }
  }
  else {
    c._2_1_ = 0;
    for (local_38 = *start; this = start_local, local_38 != *_column_local + 1;
        local_38 = local_38 + 1) {
      if (*local_38 == '\"') {
        c._2_1_ = (c._2_1_ ^ 0xff) & 1;
      }
      if (((c._2_1_ & 1) == 0) && (bVar1 = IsSpaceOrNewLine<char>(*local_38), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_58,"unexpected whitespace in token",&local_59)
        ;
        TokenizeError(&local_58,type_local,uStack_28);
      }
    }
    if ((c._2_1_ & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"non-terminated double quotes",&local_91);
      TokenizeError(&local_90,type_local,uStack_28);
    }
    this_00 = (Token *)operator_new(0x28);
    Token::Token(this_00,*end_local,*_column_local + 1,c._4_4_,type_local,uStack_28);
    local_a0 = this_00;
    std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::push_back
              ((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
               this,&local_a0);
  }
  *_column_local = (char *)0x0;
  *end_local = (char *)0x0;
  return;
}

Assistant:

void ProcessDataToken( TokenList& output_tokens, const char*& start, const char*& end,
                      unsigned int line,
                      unsigned int column,
                      TokenType type = TokenType_DATA,
                      bool must_have_token = false)
{
    if (start && end) {
        // sanity check:
        // tokens should have no whitespace outside quoted text and [start,end] should
        // properly delimit the valid range.
        bool in_double_quotes = false;
        for (const char* c = start; c != end + 1; ++c) {
            if (*c == '\"') {
                in_double_quotes = !in_double_quotes;
            }

            if (!in_double_quotes && IsSpaceOrNewLine(*c)) {
                TokenizeError("unexpected whitespace in token", line, column);
            }
        }

        if (in_double_quotes) {
            TokenizeError("non-terminated double quotes", line, column);
        }

        output_tokens.push_back(new_Token(start,end + 1,type,line,column));
    }
    else if (must_have_token) {
        TokenizeError("unexpected character, expected data token", line, column);
    }

    start = end = NULL;
}